

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

void cnn::TensorTools::RandomizeNormal(real mean,real stddev,Tensor *val)

{
  long in_RDI;
  anon_class_8_1_c254ac82 b;
  normal_distribution<float> distribution;
  result_type_conflict2 in_stack_ffffffffffffffb8;
  result_type_conflict2 in_stack_ffffffffffffffbc;
  normal_distribution<float> *in_stack_ffffffffffffffc0;
  anon_class_8_1_c254ac82 __gen;
  
  std::normal_distribution<float>::normal_distribution
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  __gen.distribution = *(normal_distribution<float> **)(in_RDI + 0x28);
  Dim::size((Dim *)__gen.distribution);
  std::generate<float*,cnn::TensorTools::RandomizeNormal(float,float,cnn::Tensor&)::__0>
            ((float *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             (float *)0x510722,__gen);
  return;
}

Assistant:

void TensorTools::RandomizeNormal(real mean, real stddev, Tensor& val) {
  normal_distribution<real> distribution(mean, stddev);
  auto b = [&] {return distribution(*rndeng);};
  generate(val.v, val.v + val.d.size(), b);
}